

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,tagbstring *x)

{
  int iVar1;
  uchar *puVar2;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  string local_60;
  CBStringException local_40;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00184840;
  iVar1 = x->slen;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  (this->super_tagbstring).data = (uchar *)0x0;
  if ((-1 < (long)iVar1) && (x->data != (uchar *)0x0)) {
    puVar2 = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = puVar2;
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 != (uchar *)0x0) {
    memcpy(puVar2,x->data,(long)iVar1);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    return;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CBString::Failure in (tagbstring) constructor","");
  CBStringException::CBStringException(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_40);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const tagbstring& x) {
	slen = x.slen;
	mlen = slen + 1;
	data = NULL;
	if (slen >= 0 && x.data != NULL) data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		bstringThrow ("Failure in (tagbstring) constructor");
	} else {
		bstr__memcpy (data, x.data, slen);
		data[slen] = '\0';
	}
}